

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O2

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapArrayInfoCore<double,double>
               (SnapArrayInfo<double> *arrayInfo,JavascriptArray *arrayObj,InflateMap *inflator)

{
  SnapArrayInfoBlock<double> *pSVar1;
  SnapArrayInfoBlock<double> **ppSVar2;
  uint32 i;
  ulong uVar3;
  double newValue;
  
  ppSVar2 = &arrayInfo->Data;
  while (pSVar1 = *ppSVar2, pSVar1 != (SnapArrayInfoBlock<double> *)0x0) {
    for (uVar3 = 0; uVar3 < pSVar1->LastIndex - pSVar1->FirstIndex; uVar3 = uVar3 + 1) {
      if (pSVar1->ArrayValidTags[uVar3] != '\0') {
        newValue = SnapArrayInfo_InflateValue(pSVar1->ArrayRangeContents[uVar3],inflator);
        Js::JavascriptArray::DirectSetItemAt<double>
                  (arrayObj,pSVar1->FirstIndex + (int)uVar3,newValue);
      }
    }
    ppSVar2 = &pSVar1->Next;
  }
  Js::JavascriptArray::SetLength(arrayObj,arrayInfo->Length);
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapArrayInfoCore(SnapArrayInfo<T>* arrayInfo, Js::JavascriptArray* arrayObj, InflateMap* inflator)
        {
            const SnapArrayInfoBlock<T>* dataBlock = arrayInfo->Data;

            while(dataBlock != nullptr)
            {
                for(uint32 i = 0; i < (dataBlock->LastIndex - dataBlock->FirstIndex); ++i)
                {
                    if(dataBlock->ArrayValidTags[i])
                    {
                        T ttdVal = dataBlock->ArrayRangeContents[i];
                        U jsVal = SnapArrayInfo_InflateValue(ttdVal, inflator);

                        arrayObj->DirectSetItemAt<U>(i + dataBlock->FirstIndex, jsVal);
                    }
                }
                dataBlock = dataBlock->Next;
            }

            //Ensure this value is set correctly in case of sparse arrays
            arrayObj->SetLength(arrayInfo->Length);
        }